

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-execution.h
# Opt level: O2

void wasm::
     LinearExecutionWalker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
     ::scan(ConstantGlobalApplier *self,Expression **currp)

{
  Id IVar1;
  Expression *this;
  Expression **ppEVar2;
  Block *pBVar3;
  Expression **ppEVar4;
  Try *pTVar5;
  Switch *pSVar6;
  Call *pCVar7;
  Loop *pLVar8;
  Break *pBVar9;
  If *pIVar10;
  Return *pRVar11;
  Throw *pTVar12;
  CallRef *pCVar13;
  BrOn *pBVar14;
  TryTable *pTVar15;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_00;
  Expression **extraout_RDX_03;
  Expression **currp_01;
  ConstantGlobalApplier *currp_02;
  bool isReturn;
  code *pcVar16;
  Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
  *pWVar17;
  ulong uVar18;
  undefined1 local_58 [8];
  anon_class_16_2_f793d67d handleCall;
  ConstantGlobalApplier *local_40;
  Expression **currp_local;
  ConstantGlobalApplier *self_local;
  
  local_58 = (undefined1  [8])&currp_local;
  handleCall.self = &local_40;
  this = *currp;
  IVar1 = this->_id;
  local_40 = (ConstantGlobalApplier *)currp;
  currp_local = (Expression **)self;
  switch(IVar1) {
  case InvalidId:
    handle_unreachable("bad id",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                       ,0x62);
  case BlockId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitBlock,currp);
    pBVar3 = Expression::cast<wasm::Block>(this);
    if ((pBVar3->name).super_IString.str._M_str != (char *)0x0) {
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                 (Expression **)local_40);
    }
    pBVar3 = Expression::cast<wasm::Block>(this);
    uVar18 = (ulong)(uint)(pBVar3->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar18) {
      uVar18 = uVar18 - 1;
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)(currp_local + 0xb);
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar3->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar18);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask(pWVar17,scan,ppEVar4);
    }
    return;
  case IfId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitIf,currp);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
               (Expression **)local_40);
    pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               *)(currp_local + 0xb);
    pIVar10 = Expression::cast<wasm::If>(this);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::maybePushTask(pWVar17,(TaskFunc)&pIVar10->ifFalse,currp_00);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
               (Expression **)local_40);
    pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               *)(currp_local + 0xb);
    pIVar10 = Expression::cast<wasm::If>(this);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask(pWVar17,scan,&pIVar10->ifTrue);
    if (*(char *)((long)currp_local + 0x131) == '\0') {
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                 (Expression **)local_40);
    }
    pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               *)(currp_local + 0xb);
    pIVar10 = Expression::cast<wasm::If>(this);
    currp_02 = (ConstantGlobalApplier *)&pIVar10->condition;
    goto LAB_00ba9e39;
  case LoopId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitLoop,currp);
    pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               *)(currp_local + 0xb);
    pLVar8 = Expression::cast<wasm::Loop>(this);
    currp = &pLVar8->body;
    pcVar16 = scan;
    goto LAB_00ba9d31;
  case BreakId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitBreak,currp);
    pBVar9 = Expression::cast<wasm::Break>(this);
    if ((pBVar9->condition == (Expression *)0x0) ||
       (ppEVar4 = extraout_RDX_00, *(char *)((long)currp_local + 0x131) == '\0')) {
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                 (Expression **)local_40);
      ppEVar4 = extraout_RDX_01;
    }
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::maybePushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                     *)(currp_local + 0xb),(TaskFunc)&pBVar9->condition,ppEVar4);
    ppEVar4 = &pBVar9->value;
    currp_01 = extraout_RDX_02;
    ppEVar2 = currp_local;
    break;
  case SwitchId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitSwitch,currp);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
               (Expression **)local_40);
    pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               *)(currp_local + 0xb);
    pSVar6 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask(pWVar17,scan,&pSVar6->condition);
    ppEVar2 = currp_local;
    pSVar6 = Expression::cast<wasm::Switch>(this);
    ppEVar4 = &pSVar6->value;
    currp_01 = extraout_RDX;
    break;
  case CallId:
    pCVar7 = Expression::cast<wasm::Call>(this);
    isReturn = pCVar7->isReturn;
LAB_00ba9de2:
    scan::anon_class_16_2_f793d67d::operator()((anon_class_16_2_f793d67d *)local_58,isReturn);
    return;
  case CallIndirectId:
  case LocalGetId:
  case LocalSetId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ConstId:
  case UnaryId:
  case BinaryId:
  case SelectId:
  case DropId:
switchD_00ba99c2_caseD_7:
    PostWalker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::scan(self,currp);
    return;
  case ReturnId:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)&self->field_0x58,
               Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
               ::doVisitReturn,currp);
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
               (Expression **)local_40);
    ppEVar2 = currp_local;
    pRVar11 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar11->value;
    currp_01 = extraout_RDX_03;
    break;
  default:
    switch(IVar1) {
    case TryId:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitTry,currp);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                 (Expression **)local_40);
      handleCall.currp = (Expression ***)this;
      pTVar5 = Expression::cast<wasm::Try>(this);
      uVar18 = (ulong)(uint)(pTVar5->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            .usedElements;
      while (0 < (int)uVar18) {
        uVar18 = uVar18 - 1;
        pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                   *)(currp_local + 0xb);
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pTVar5->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,uVar18);
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask(pWVar17,scan,ppEVar4);
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                    *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                   (Expression **)local_40);
      }
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)(currp_local + 0xb);
      pTVar5 = Expression::cast<wasm::Try>((Expression *)handleCall.currp);
      currp_02 = (ConstantGlobalApplier *)&pTVar5->body;
      break;
    case TryTableId:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitTryTable,currp);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                 (Expression **)local_40);
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)(currp_local + 0xb);
      pTVar15 = Expression::cast<wasm::TryTable>(this);
      currp_02 = (ConstantGlobalApplier *)&pTVar15->body;
      pcVar16 = scan;
      goto LAB_00ba9e8b;
    case ThrowId:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitThrow,currp);
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                 (Expression **)local_40);
      pTVar12 = Expression::cast<wasm::Throw>(this);
      uVar18 = (ulong)(uint)(pTVar12->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            .usedElements;
      while (0 < (int)uVar18) {
        uVar18 = uVar18 - 1;
        pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                   *)(currp_local + 0xb);
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pTVar12->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,uVar18);
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask(pWVar17,scan,ppEVar4);
      }
      return;
    case RethrowId:
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)&self->field_0x58;
      pcVar16 = Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                ::doVisitRethrow;
      goto LAB_00ba9d31;
    case ThrowRefId:
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case RefTestId:
    case RefCastId:
      goto switchD_00ba99c2_caseD_7;
    case CallRefId:
      pCVar13 = Expression::cast<wasm::CallRef>(this);
      isReturn = pCVar13->isReturn;
      goto LAB_00ba9de2;
    case BrOnId:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                  *)&self->field_0x58,
                 Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 ::doVisitBrOn,currp);
      if (*(char *)((long)currp_local + 0x131) == '\0') {
        Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                    *)(currp_local + 0xb),anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear,
                   (Expression **)local_40);
      }
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)(currp_local + 0xb);
      pBVar14 = Expression::cast<wasm::BrOn>(this);
      currp_02 = (ConstantGlobalApplier *)&pBVar14->ref;
      break;
    default:
      if (IVar1 != UnreachableId) goto switchD_00ba99c2_caseD_7;
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)&self->field_0x58;
      pcVar16 = Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                ::doVisitUnreachable;
LAB_00ba9d31:
      Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
      ::pushTask(pWVar17,pcVar16,currp);
      pWVar17 = (Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                 *)(currp_local + 0xb);
      pcVar16 = anon_unknown_163::ConstantGlobalApplier::doNoteNonLinear;
      currp_02 = local_40;
      goto LAB_00ba9e8b;
    }
LAB_00ba9e39:
    pcVar16 = scan;
LAB_00ba9e8b:
    Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
    ::pushTask(pWVar17,pcVar16,(Expression **)currp_02);
    return;
  }
  Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
  ::maybePushTask((Walker<wasm::(anonymous_namespace)::ConstantGlobalApplier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::ConstantGlobalApplier,_void>_>
                   *)(ppEVar2 + 0xb),(TaskFunc)ppEVar4,currp_01);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    auto handleCall = [&](bool isReturn) {
      if (!self->connectAdjacentBlocks) {
        // Control is nonlinear if we return, or if EH is enabled or may be.
        if (isReturn || !self->getModule() ||
            self->getModule()->features.hasExceptionHandling()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
      }

      // Scan the children normally.
      PostWalker<SubType, VisitorType>::scan(self, currp);
    };

    switch (curr->_id) {
      case Expression::Id::InvalidId:
        WASM_UNREACHABLE("bad id");
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doVisitBlock, currp);
        if (curr->cast<Block>()->name.is()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        auto& list = curr->cast<Block>()->list;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doVisitIf, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<If>()->ifFalse);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        break;
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doVisitLoop, currp);
        self->pushTask(SubType::scan, &curr->cast<Loop>()->body);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BreakId: {
        self->pushTask(SubType::doVisitBreak, currp);
        auto* br = curr->cast<Break>();
        // If there is no condition then we note non-linearity as the code after
        // us is unreachable anyhow (we do the same for Switch, Return, etc.).
        // If there is a condition, then we note or do not note depending on
        // whether we allow adjacent blocks.
        if (!br->condition || !self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->maybePushTask(SubType::scan, &br->condition);
        self->maybePushTask(SubType::scan, &br->value);
        break;
      }
      case Expression::Id::SwitchId: {
        self->pushTask(SubType::doVisitSwitch, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<Switch>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Switch>()->value);
        break;
      }
      case Expression::Id::ReturnId: {
        self->pushTask(SubType::doVisitReturn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Return>()->value);
        break;
      }
      case Expression::Id::CallId: {
        handleCall(curr->cast<Call>()->isReturn);
        return;
      }
      case Expression::Id::CallRefId: {
        handleCall(curr->cast<CallRef>()->isReturn);
        return;
      }
      case Expression::Id::TryId: {
        self->pushTask(SubType::doVisitTry, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Try>()->catchBodies;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doVisitTryTable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<TryTable>()->body);
        break;
      }
      case Expression::Id::ThrowId: {
        self->pushTask(SubType::doVisitThrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Throw>()->operands;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::RethrowId: {
        self->pushTask(SubType::doVisitRethrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::UnreachableId: {
        self->pushTask(SubType::doVisitUnreachable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BrOnId: {
        self->pushTask(SubType::doVisitBrOn, currp);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<BrOn>()->ref);
        break;
      }
      default: {
        // All relevant things should have been handled.
        assert(!Properties::isControlFlowStructure(curr));
        assert(!Properties::isBranch(curr));
        // other node types do not have control flow, use regular post-order
        PostWalker<SubType, VisitorType>::scan(self, currp);
      }
    }
  }